

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::EmitOpcode(Parser *this,Opcode opcode)

{
  pointer pDVar1;
  bool bVar2;
  uchar v;
  undefined1 local_19;
  DebugLineEntry local_18;
  
  bVar2 = EnableDebugInfo();
  if ((bVar2) &&
     ((pDVar1 = (this->m_debugLines).
                super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      (this->m_debugLines).
      super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pDVar1 ||
      (pDVar1[-1].lineNumber != this->m_lastLine)))) {
    local_18.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    local_18.lineNumber = this->m_lastLine;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_18);
  }
  local_19 = (char)opcode;
  Buffer::Write((this->m_writer).m_buffer.
                super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                &(this->m_writer).m_pos,&local_19,1);
  return;
}

Assistant:

inline_t void Parser::EmitOpcode(Opcode opcode)
	{
		// Only bother with writing this information if we're generating debug info
		if (EnableDebugInfo())
		{
			// Only write a new entry when we're at a new line, since that's all we're tracking
			if (m_debugLines.empty() || m_debugLines.back().lineNumber != m_lastLine)
			{
				auto pos = static_cast<uint32_t>(m_writer.Tell());
				m_debugLines.push_back({ pos, m_lastLine });
			}
		}
		m_writer.Write<Opcode, uint8_t>(opcode);
	}